

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
duckdb::
make_uniq_base<duckdb::Expression,duckdb::BoundReferenceExpression,duckdb::LogicalType&,unsigned_long&>
          (LogicalType *args,unsigned_long *args_1)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> in_RDI;
  storage_t in_stack_00000010;
  LogicalType *in_stack_00000018;
  BoundReferenceExpression *in_stack_00000020;
  _Head_base<0UL,_duckdb::Expression_*,_false> this;
  
  this._M_head_impl = in_RDI._M_head_impl;
  operator_new(0x60);
  LogicalType::LogicalType((LogicalType *)this._M_head_impl,(LogicalType *)in_RDI._M_head_impl);
  BoundReferenceExpression::BoundReferenceExpression
            (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
  unique_ptr<std::default_delete<duckdb::Expression>,void>
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             this._M_head_impl,in_RDI._M_head_impl);
  LogicalType::~LogicalType((LogicalType *)0x18ea2fa);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         this._M_head_impl;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}